

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O1

ps_mgau_t * s2_semi_mgau_init(acmod_t *acmod)

{
  short sVar1;
  uint nfeat;
  uint uVar2;
  feat_t *pfVar3;
  vqFeature_t *pvVar4;
  int iVar5;
  s2_semi_mgau_t *s;
  logmath_t *plVar6;
  char *pcVar7;
  char *varfile;
  gauden_t *pgVar8;
  long lVar9;
  uint8 *puVar10;
  vqFeature_t ***pppvVar11;
  uint8 **ppuVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint32 *puVar16;
  size_t sVar17;
  size_t n_elem;
  float64 base;
  double dVar18;
  
  s = (s2_semi_mgau_t *)
      __ckd_calloc__(1,0x80,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                     ,0x4d5);
  s->config = acmod->config;
  plVar6 = logmath_retain(acmod->lmath);
  s->lmath = plVar6;
  base = logmath_get_base(acmod->lmath);
  plVar6 = logmath_init(base,10,1);
  s->lmath_8b = plVar6;
  if (plVar6 != (logmath_t *)0x0) {
    iVar5 = logmath_get_width(plVar6);
    if (iVar5 == 1) {
      pcVar7 = ps_config_str(s->config,"mean");
      varfile = ps_config_str(s->config,"var");
      dVar18 = ps_config_float(s->config,"varfloor");
      pgVar8 = gauden_init(pcVar7,varfile,(float32)(float)dVar18,s->lmath);
      s->g = pgVar8;
      if (pgVar8 == (gauden_t *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x4e9,"Failed to read means and variances\n");
      }
      else if (pgVar8->n_mgau == 1) {
        nfeat = pgVar8->n_feat;
        n_elem = (size_t)(int)nfeat;
        pfVar3 = acmod->fcb;
        uVar2 = pfVar3->n_sv;
        uVar13 = uVar2;
        if (uVar2 == 0) {
          uVar13 = pfVar3->n_stream;
        }
        if (nfeat == uVar13) {
          if (0 < (int)nfeat) {
            lVar9 = 0;
            uVar14 = 0;
            do {
              puVar16 = &pfVar3->out_dim;
              if (pfVar3->lda == (mfcc_t ***)0x0) {
                if (pfVar3->sv_len == (uint32 *)0x0) {
                  puVar16 = (uint32 *)((long)pfVar3->stream_len + lVar9);
                }
                else {
                  puVar16 = pfVar3->sv_len + uVar14;
                }
              }
              uVar2 = *(uint *)((long)pgVar8->featlen + lVar9);
              if (uVar2 != *puVar16) {
                pcVar7 = "Dimension of stream %d does not match: %d != %d\n";
                lVar9 = 0x4fc;
                goto LAB_00140232;
              }
              uVar14 = uVar14 + 1;
              lVar9 = lVar9 + 4;
            } while (n_elem * 4 - lVar9 != 0);
          }
          pcVar7 = ps_config_str(s->config,"sendump");
          if (pcVar7 == (char *)0x0) {
            pcVar7 = ps_config_str(s->config,"mixw");
            dVar18 = ps_config_float(s->config,"mixwfloor");
            iVar5 = read_mixw(s,pcVar7,dVar18);
          }
          else {
            iVar5 = read_sendump(s,acmod->mdef,pcVar7);
          }
          if (-1 < iVar5) {
            lVar9 = ps_config_int(s->config,"ds");
            s->ds_ratio = (int16)lVar9;
            puVar10 = (uint8 *)__ckd_calloc__(n_elem,1,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                              ,0x50f);
            s->topn_beam = puVar10;
            lVar9 = ps_config_int(s->config,"topn");
            s->max_topn = (int16)lVar9;
            pcVar7 = ps_config_str(s->config,"topn_beam");
            split_topn(pcVar7,s->topn_beam,nfeat);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                    ,0x512,"Maximum top-N: %d ",(ulong)(uint)(int)s->max_topn);
            err_msg(ERR_INFO,(char *)0x0,0,"Top-N beams:");
            if (0 < (int)nfeat) {
              sVar17 = 0;
              do {
                err_msg(ERR_INFO,(char *)0x0,0," %d",(ulong)s->topn_beam[sVar17]);
                sVar17 = sVar17 + 1;
              } while (n_elem != sVar17);
            }
            err_msg(ERR_INFO,(char *)0x0,0,"\n");
            lVar9 = ps_config_int(s->config,"pl_window");
            iVar5 = (int)lVar9 + 2;
            s->n_topn_hist = iVar5;
            pppvVar11 = (vqFeature_t ***)
                        __ckd_calloc_3d__((long)iVar5,n_elem,(long)s->max_topn,8,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                          ,0x51d);
            s->topn_hist = pppvVar11;
            ppuVar12 = (uint8 **)
                       __ckd_calloc_2d__((long)s->n_topn_hist,n_elem,1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                         ,0x51f);
            s->topn_hist_n = ppuVar12;
            iVar5 = s->n_topn_hist;
            if (0 < (long)iVar5) {
              lVar9 = 0;
              do {
                if (0 < (int)nfeat) {
                  sVar1 = s->max_topn;
                  sVar17 = 0;
                  do {
                    if (0 < sVar1) {
                      pvVar4 = s->topn_hist[lVar9][sVar17];
                      lVar15 = 0;
                      do {
                        pvVar4[lVar15].score = -0x80000000;
                        pvVar4[lVar15].codeword = (int32)lVar15;
                        lVar15 = lVar15 + 1;
                      } while (sVar1 != lVar15);
                    }
                    sVar17 = sVar17 + 1;
                  } while (sVar17 != n_elem);
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 != iVar5);
            }
            (s->base).vt = &s2_semi_mgau_funcs;
            return &s->base;
          }
        }
        else {
          if (uVar2 == 0) {
            uVar2 = pfVar3->n_stream;
          }
          pcVar7 = "Number of streams does not match: %d != %d\n";
          lVar9 = 0x4f6;
          uVar14 = (ulong)nfeat;
LAB_00140232:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                  ,lVar9,pcVar7,uVar14,(ulong)uVar2);
        }
      }
    }
    else {
      logmath_get_base(s->lmath_8b);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
              ,0x4e0,"Log base %f is too small to represent add table in 8 bits\n");
    }
  }
  s2_semi_mgau_free((ps_mgau_t *)s);
  return (ps_mgau_t *)0x0;
}

Assistant:

ps_mgau_t *
s2_semi_mgau_init(acmod_t *acmod)
{
    s2_semi_mgau_t *s;
    ps_mgau_t *ps;
    char const *sendump_path;
    int i;
    int n_feat;

    s = ckd_calloc(1, sizeof(*s));
    s->config = acmod->config;

    s->lmath = logmath_retain(acmod->lmath);
    /* Log-add table. */
    s->lmath_8b = logmath_init(logmath_get_base(acmod->lmath), SENSCR_SHIFT, TRUE);
    if (s->lmath_8b == NULL)
        goto error_out;
    /* Ensure that it is only 8 bits wide so that fast_logmath_add() works. */
    if (logmath_get_width(s->lmath_8b) != 1) {
        E_ERROR("Log base %f is too small to represent add table in 8 bits\n",
                logmath_get_base(s->lmath_8b));
        goto error_out;
    }

    /* Read means and variances. */
    if ((s->g = gauden_init(ps_config_str(s->config, "mean"),
                            ps_config_str(s->config, "var"),
                            ps_config_float(s->config, "varfloor"),
                            s->lmath)) == NULL) {
        E_ERROR("Failed to read means and variances\n");	
        goto error_out;
    }

    /* Currently only a single codebook is supported. */
    if (s->g->n_mgau != 1)
        goto error_out;

    n_feat = s->g->n_feat;

    /* Verify n_feat and veclen, against acmod. */
    if (n_feat != feat_dimension1(acmod->fcb)) {
        E_ERROR("Number of streams does not match: %d != %d\n",
                n_feat, feat_dimension1(acmod->fcb));
        goto error_out;
    }
    for (i = 0; i < n_feat; ++i) {
        if ((uint32)s->g->featlen[i] != feat_dimension2(acmod->fcb, i)) {
            E_ERROR("Dimension of stream %d does not match: %d != %d\n",
                    i, s->g->featlen[i], feat_dimension2(acmod->fcb, i));
            goto error_out;
        }
    }
    /* Read mixture weights */
    if ((sendump_path = ps_config_str(s->config, "sendump"))) {
        if (read_sendump(s, acmod->mdef, sendump_path) < 0) {
            goto error_out;
        }
    }
    else {
        if (read_mixw(s, ps_config_str(s->config, "mixw"),
                      ps_config_float(s->config, "mixwfloor")) < 0) {
            goto error_out;
        }
    }
    s->ds_ratio = ps_config_int(s->config, "ds");

    /* Determine top-N for each feature */
    s->topn_beam = ckd_calloc(n_feat, sizeof(*s->topn_beam));
    s->max_topn = ps_config_int(s->config, "topn");
    split_topn(ps_config_str(s->config, "topn_beam"), s->topn_beam, n_feat);
    E_INFO("Maximum top-N: %d ", s->max_topn);
    E_INFOCONT("Top-N beams:");
    for (i = 0; i < n_feat; ++i) {
        E_INFOCONT(" %d", s->topn_beam[i]);
    }
    E_INFOCONT("\n");

    /* Top-N scores from recent frames */
    s->n_topn_hist = ps_config_int(s->config, "pl_window") + 2;
    s->topn_hist = (vqFeature_t ***)
        ckd_calloc_3d(s->n_topn_hist, n_feat, s->max_topn,
                      sizeof(***s->topn_hist));
    s->topn_hist_n = ckd_calloc_2d(s->n_topn_hist, n_feat,
                                   sizeof(**s->topn_hist_n));
    for (i = 0; i < s->n_topn_hist; ++i) {
        int j;
        for (j = 0; j < n_feat; ++j) {
            int k;
            for (k = 0; k < s->max_topn; ++k) {
                s->topn_hist[i][j][k].score = WORST_DIST;
                s->topn_hist[i][j][k].codeword = k;
            }
        }
    }

    ps = (ps_mgau_t *)s;
    ps->vt = &s2_semi_mgau_funcs;
    return ps;
error_out:
    s2_semi_mgau_free(ps_mgau_base(s));
    return NULL;
}